

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::filter_coarsen_dirs(Omega_h *this,Read<signed_char> *codes,Read<signed_char> *keep_dirs)

{
  Alloc *pAVar1;
  ulong uVar2;
  void *extraout_RDX;
  LO size_in;
  uint uVar3;
  Read<signed_char> RVar4;
  Write<signed_char> codes_w;
  type f;
  Write<signed_char> local_e0;
  Write<signed_char> local_d0;
  string local_c0;
  Write<signed_char> local_a0;
  Write<signed_char> local_90;
  Write<signed_char> local_80;
  Write<signed_char> local_70;
  Write<signed_char> local_60;
  Write<signed_char> local_50;
  Write<signed_char> local_40;
  
  pAVar1 = (codes->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    size_in = (LO)pAVar1->size;
  }
  else {
    size_in = (LO)((ulong)pAVar1 >> 3);
  }
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_90);
  Write<signed_char>::Write(&local_e0,size_in,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  Write<signed_char>::Write(&local_60,&codes->write_);
  Write<signed_char>::Write(&local_50,&keep_dirs->write_);
  Write<signed_char>::Write(&local_40,&local_e0);
  if (((ulong)local_e0.shared_alloc_.alloc & 1) == 0) {
    uVar3 = (uint)(local_e0.shared_alloc_.alloc)->size;
  }
  else {
    uVar3 = (uint)((ulong)local_e0.shared_alloc_.alloc >> 3);
  }
  Write<signed_char>::Write(&local_90,&local_60);
  Write<signed_char>::Write(&local_80,&local_50);
  Write<signed_char>::Write(&local_70,&local_40);
  if (0 < (int)uVar3) {
    entering_parallel = 1;
    Write<signed_char>::Write((Write<signed_char> *)&local_c0,&local_90);
    Write<signed_char>::Write((Write<signed_char> *)&local_c0.field_2,&local_80);
    Write<signed_char>::Write(&local_a0,&local_70);
    entering_parallel = 0;
    for (uVar2 = 0; (uVar3 & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
      *(byte *)((long)local_a0.shared_alloc_.direct_ptr + uVar2) =
           (-(*(char *)(local_c0.field_2._8_8_ + 1 + uVar2 * 2) != '\0') | 0xfdU) &
           *(byte *)(local_c0._M_string_length + uVar2) &
           ~(*(char *)(local_c0.field_2._8_8_ + uVar2 * 2) == '\0');
    }
    filter_coarsen_dirs(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0
              ((__0 *)&local_c0);
  }
  filter_coarsen_dirs(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_90);
  Write<signed_char>::Write(&local_d0,&local_e0);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_d0);
  Write<signed_char>::~Write(&local_d0);
  filter_coarsen_dirs(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_60);
  Write<signed_char>::~Write(&local_e0);
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<I8> filter_coarsen_dirs(Read<I8> codes, Read<I8> keep_dirs) {
  auto codes_w = Write<I8>(codes.size());
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto code = codes[cand];
    for (Int dir = 0; dir < 2; ++dir) {
      if (!keep_dirs[cand * 2 + dir]) {
        code = dont_collapse(code, dir);
      }
    }
    codes_w[cand] = code;
  };
  parallel_for(codes_w.size(), f, "filter_coarsen_dirs");
  return codes_w;
}